

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

iterator * __thiscall
google::
dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::erase(iterator *__return_storage_ptr__,
       dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *this,const_iterator pos)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_30;
  
  local_30.pos = this->table + this->num_buckets;
  local_30.ht = this;
  local_30.end = local_30.pos;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_30);
  if (pos.pos == local_30.pos) {
    ppVar2 = this->table + this->num_buckets;
    ppVar3 = this->table + this->num_buckets;
  }
  else {
    bVar1 = set_deleted(this,&pos);
    ppVar2 = pos.pos;
    ppVar3 = pos.end;
    if (bVar1) {
      this->num_deleted = this->num_deleted + 1;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      consider_shrink_ = true;
    }
  }
  __return_storage_ptr__->ht = this;
  __return_storage_ptr__->pos = ppVar2;
  __return_storage_ptr__->end = ppVar3;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator erase(const_iterator pos) {
    if (pos == end()) return end();  // sanity check
    if (set_deleted(pos)) {    // true if object has been newly deleted
      ++num_deleted;
      settings.set_consider_shrink(
          true);  // will think about shrink after next insert
    }
    return iterator(this, const_cast<pointer>(pos.pos), const_cast<pointer>(pos.end), true);
  }